

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_dependency.cpp
# Opt level: O3

CatalogEntryInfo *
duckdb::CatalogEntryInfo::Deserialize
          (CatalogEntryInfo *__return_storage_ptr__,Deserializer *deserializer)

{
  CatalogType CVar1;
  int iVar2;
  uint uVar3;
  string str;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  (__return_storage_ptr__->schema)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->schema).field_2;
  (__return_storage_ptr__->schema)._M_string_length = 0;
  (__return_storage_ptr__->schema).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    CVar1 = EnumUtil::FromString<duckdb::CatalogType>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    CVar1 = (CatalogType)iVar2;
  }
  __return_storage_ptr__->type = CVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"schema");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->schema,(string *)&local_50)
    ;
    if (local_50 != local_40) goto LAB_0108f890;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->schema,(string *)&local_50)
    ;
    if (local_50 != local_40) {
LAB_0108f890:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"name");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0108f926;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0108f926;
  }
  operator_delete(local_50);
LAB_0108f926:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryInfo CatalogEntryInfo::Deserialize(Deserializer &deserializer) {
	CatalogEntryInfo result;
	deserializer.ReadProperty<CatalogType>(100, "type", result.type);
	deserializer.ReadPropertyWithDefault<string>(101, "schema", result.schema);
	deserializer.ReadPropertyWithDefault<string>(102, "name", result.name);
	return result;
}